

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O2

int * compute_cells(int *dims,int *ncells)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  lVar5 = ((long)dims[2] + -1) * ((long)dims[1] + -1) * ((long)*dims + -1);
  *ncells = (int)lVar5;
  piVar6 = (int *)malloc(lVar5 * 0x18);
  iVar8 = *dims;
  iVar18 = dims[1];
  iVar1 = iVar8 + -1;
  iVar9 = dims[2];
  iVar7 = (iVar18 + -1) * iVar1 * iVar9;
  iVar10 = (iVar18 + -1) * iVar9;
  iVar13 = (iVar9 + -1) * iVar18;
  iVar14 = 1;
  piVar15 = piVar6;
  iVar4 = 0;
  while (iVar4 < iVar9 + -1) {
    iVar9 = 1;
    iVar19 = 0;
    while (iVar19 < iVar18 + -1) {
      iVar17 = 0;
      iVar18 = (iVar13 + iVar10) * iVar1;
      while( true ) {
        iVar2 = iVar8 + -1;
        if (iVar2 <= iVar17) break;
        iVar16 = iVar4 * dims[1];
        iVar3 = iVar7 + iVar17;
        iVar11 = dims[1] + -1;
        iVar12 = iVar11 * iVar4 + iVar19;
        iVar8 = iVar8 * iVar12;
        *piVar15 = (iVar19 + iVar16) * iVar2 + iVar3;
        piVar15[1] = (iVar16 + iVar9) * iVar2 + iVar3;
        piVar15[2] = iVar8 + iVar18 + 1;
        piVar15[3] = iVar8 + iVar18;
        piVar15[4] = (iVar14 * iVar11 + iVar19) * iVar2 + iVar17;
        piVar15[5] = iVar2 * iVar12 + iVar17;
        piVar15 = piVar15 + 6;
        iVar17 = iVar17 + 1;
        iVar8 = *dims;
        iVar18 = iVar18 + 1;
      }
      iVar9 = iVar9 + 1;
      iVar19 = iVar19 + 1;
      iVar18 = dims[1];
    }
    iVar14 = iVar14 + 1;
    iVar4 = iVar4 + 1;
    iVar9 = dims[2];
  }
  return piVar6;
}

Assistant:

int *
compute_cells(const int *dims, int *ncells) {
  int i,j,k;
  *ncells = (dims[0]-1)*(dims[1]-1)*(dims[2]-1);
  int *cells = (int *)malloc(*ncells * sizeof(int)*6);
  int *cptr = cells;

  int F1 = (dims[0]-1)*(dims[1]-1)*dims[2];     /* back/front */
  int F2 = (dims[0]-1)*(dims[1])  *(dims[2]-1); /* bottom/top */
  // int F3 = (dims[0])  *(dims[1]-1)*(dims[2]-1); /* left/right */

  for(k = 0; k < dims[2]-1; k++)
    for(j = 0; j < dims[1]-1; j++)
      for(i = 0; i < dims[0]-1; i++) {
        int f0 = F1 + k*(dims[0]-1)*dims[1] + j*(dims[0]-1) + i;     /* bottom */
        int f1 = F1 + k*(dims[0]-1)*dims[1] + (j+1)*(dims[0]-1) + i; /* top */
        int f2 = (k+1)*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;  /* front */
        int f3 = k*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;      /* back  */
        int f4 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i;      /* left */
        int f5 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i+1;    /* right */

        /* This ordering works (see fms.h) */
        *cptr++ = f0;
        *cptr++ = f1;
        *cptr++ = f5;
        *cptr++ = f4;
        *cptr++ = f2;
        *cptr++ = f3;
      }
#ifdef DEBUG_PRINT
  for(i = 0; i < *ncells; i++)
    printf("cell %d: %d %d %d %d %d %d\n", i,
           cells[6*i+0],
           cells[6*i+1],
           cells[6*i+2],
           cells[6*i+3],
           cells[6*i+4],
           cells[6*i+5]
          );
#endif

  return cells;
}